

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__name;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  FILE *__stream;
  size_t sVar5;
  FILE *pFVar6;
  char *pcVar7;
  addrinfo *ai;
  char get [1024];
  char buf [1024];
  char path [1024];
  addrinfo *local_1078;
  char *local_1070;
  addrinfo local_1068;
  _union_1457 local_1038;
  undefined1 local_1030 [1016];
  _union_1457 local_c38;
  undefined1 local_c30 [1015];
  char acStack_839 [1025];
  char local_438 [1032];
  
  fileName = *argv;
  bVar1 = false;
  bVar2 = true;
  pcVar7 = "8080";
  local_1070 = "index.html";
  while( true ) {
    while (iVar3 = __posix_getopt(argc,argv,"p:i:"), iVar3 != 0x70) {
      if (iVar3 != 0x69) {
        if (iVar3 != -1) goto LAB_00102c26;
        __name = argv[_optind];
        if (__name == (char *)0x0) goto LAB_00102c30;
        iVar3 = access(__name,4);
        if (iVar3 == -1) goto LAB_00102c35;
        local_1068.ai_addrlen = 0;
        local_1068._20_4_ = 0;
        local_1068.ai_addr = (sockaddr *)0x0;
        local_1068.ai_canonname = (char *)0x0;
        local_1068.ai_next = (addrinfo *)0x0;
        local_1068.ai_socktype = 1;
        local_1068.ai_protocol = 0;
        local_1068.ai_flags = 1;
        local_1068.ai_family = 2;
        iVar3 = getaddrinfo((char *)0x0,pcVar7,&local_1068,&local_1078);
        if (iVar3 != 0) goto LAB_00102c3a;
        iVar3 = socket(local_1078->ai_family,local_1078->ai_socktype,local_1078->ai_protocol);
        if (iVar3 < 0) goto LAB_00102c3f;
        iVar4 = bind(iVar3,local_1078->ai_addr,local_1078->ai_addrlen);
        if (iVar4 < 0) goto LAB_00102c44;
        iVar4 = listen(iVar3,10);
        if (iVar4 < 0) goto LAB_00102c4e;
        fprintf(_stderr,"http://localhost:%s ...\n",pcVar7);
        memset(local_c30,0,0x90);
        memset(local_1030,0,0x90);
        local_c38.sa_handler = signalHandler;
        local_1038.sa_handler = signalHandler;
        iVar4 = sigaction(2,(sigaction *)&local_c38,(sigaction *)0x0);
        if ((iVar4 != 0) ||
           (iVar4 = sigaction(0xf,(sigaction *)&local_1038,(sigaction *)0x0), iVar4 != 0))
        goto LAB_00102c58;
        if (terminate != 0) goto LAB_00102bfe;
        pcVar7 = acStack_839 + 1;
        goto LAB_00102a4d;
      }
      if (!bVar2) goto LAB_00102c2b;
      local_1070 = strdup(_optarg);
      bVar2 = false;
    }
    if (bVar1) break;
    pcVar7 = strdup(_optarg);
    iVar3 = isValidPort(pcVar7);
    bVar1 = true;
    if (iVar3 == 0) {
LAB_00102c21:
      main_cold_3();
LAB_00102c26:
      main_cold_13();
LAB_00102c2b:
      main_cold_1();
LAB_00102c30:
      main_cold_12();
LAB_00102c35:
      main_cold_11();
LAB_00102c3a:
      main_cold_4();
LAB_00102c3f:
      main_cold_10();
LAB_00102c44:
      main_cold_9();
LAB_00102c4e:
      main_cold_8();
LAB_00102c58:
      main_cold_5();
      terminate = terminate + 1;
      return extraout_EAX;
    }
  }
  main_cold_2();
  goto LAB_00102c21;
  while( true ) {
    __stream = fdopen(iVar4,"r+");
    if (__stream == (FILE *)0x0) {
      main_cold_7();
    }
    else {
      local_c38.sa_handler = local_c38.sa_handler & 0xffffffffffffff00;
      local_1038.sa_handler = local_1038.sa_handler & 0xffffffffffffff00;
      local_438[0] = '\0';
      acStack_839[1] = 0;
      fgets((char *)&local_c38,0x400,__stream);
      __isoc99_sscanf(&local_c38,"%[^ ] /%[^ ] HTTP/1.1\r\n",&local_1038,local_438);
      strcat(pcVar7,__name);
      strcat(pcVar7,local_438);
      sVar5 = strlen(pcVar7);
      if (pcVar7[sVar5 - 1] == '/') {
        strcat(pcVar7,local_1070);
      }
      fprintf(_stderr,"GET: %s PATH: %s\n",&local_1038,pcVar7);
      goToEndOfHeader((FILE *)__stream);
      if (local_1038._0_4_ == 0x544547) {
        pFVar6 = fopen(pcVar7,"r+");
        if (pFVar6 == (FILE *)0x0) {
          printHeader((FILE *)__stream,0x194,(FILE *)0x0);
          fflush(__stream);
          fclose(__stream);
          close(iVar4);
        }
        else {
          main_cold_6();
        }
      }
      else {
        fwrite("Connection: close\r\n",0x13,1,__stream);
        fwrite("\r\n",2,1,__stream);
        fflush(__stream);
        fclose(__stream);
        close(iVar4);
      }
    }
    if (terminate != 0) break;
LAB_00102a4d:
    iVar4 = accept(iVar3,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar4 < 0) {
      close(iVar4);
      break;
    }
  }
LAB_00102bfe:
  freeaddrinfo(local_1078);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
	fileName = argv[0];
	int p=0;
	int i = 0;
	char * p_port = "8080";
	char * i_index = "index.html";
	char * rootDoc = "";

	int c;
	while ((c = getopt(argc, argv, "p:i:")) != -1) {
		switch (c) {
		case 'p':if (p) { USAGE(); }
				 p++;
				 p_port = strdup(optarg);
				 if (isValidPort(p_port) == 0) {
					 ERROR_EXIT("INVALID PORT");
				 }
				 break;
		case 'i':if (i) { USAGE(); }
				 i++;
				 i_index = strdup(optarg);
				 break;
		default:
			USAGE();
		}
	}

	if ((rootDoc = argv[optind]) == NULL) {
		USAGE();
	}
	if (-1==access(rootDoc, R_OK)) {
		ERROR_EXIT("root doc can't be read from");
	}


	struct addrinfo hints, *ai;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_PASSIVE;

	int res = getaddrinfo(NULL, p_port, &hints, &ai);
	if (res != 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("getAddressInfo");
	}

	int sock_fd = socket(ai->ai_family, ai->ai_socktype, ai->ai_protocol);
	if (sock_fd < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("socket");
	}

	//int optval = 1;
	//setsockopt(sock_fd, SOL_SOCKET, SO_REUSEADDR, &optval, sizeof optval);

	if (bind(sock_fd, ai->ai_addr, ai->ai_addrlen) < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("bind");
	}

	if (listen(sock_fd, 10) < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("listen");
	}

	fprintf(stderr,"http://localhost:%s ...\n", p_port);
	setupSignalHandler();

	startRequestHandling(sock_fd,rootDoc,i_index);
	freeaddrinfo(ai);

	return 0;
}